

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt * __thiscall llvm::APInt::operator+=(APInt *this,uint64_t RHS)

{
  uint uVar1;
  APInt *pAVar2;
  ulong uVar3;
  uint64_t *puVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  
  pAVar2 = this;
  uVar1 = this->BitWidth;
  if ((ulong)uVar1 < 0x41) {
    puVar4 = (uint64_t *)(RHS + (long)(this->U).pVal);
    (this->U).pVal = puVar4;
  }
  else {
    puVar4 = (this->U).pVal;
    uVar3 = (ulong)uVar1 + 0x3f >> 6;
    lVar5 = 0;
    do {
      uVar6 = puVar4[lVar5] + RHS;
      puVar4[lVar5] = uVar6;
      if (RHS <= uVar6) break;
      RHS = 1;
      bVar7 = uVar3 - 1 != lVar5;
      lVar5 = lVar5 + 1;
    } while (bVar7);
    this = (APInt *)((this->U).pVal + ((int)uVar3 - 1));
    puVar4 = (uint64_t *)(this->U).VAL;
  }
  (this->U).VAL = (ulong)((long)puVar4 << (-(char)uVar1 & 0x3fU)) >> (-(char)uVar1 & 0x3fU);
  return pAVar2;
}

Assistant:

APInt& APInt::operator+=(uint64_t RHS) {
  if (isSingleWord())
    U.VAL += RHS;
  else
    tcAddPart(U.pVal, RHS, getNumWords());
  return clearUnusedBits();
}